

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabelPrivate::updateLabel(QLabelPrivate *this)

{
  ushort uVar1;
  QWidget *this_00;
  QSizePolicy QVar2;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  long in_FS_OFFSET;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  uVar1 = *(ushort *)&this->field_0x340;
  *(ushort *)&this->field_0x340 = uVar1 & 0xfffe;
  if ((uVar1 & 0x10) != 0) {
    QVar2 = QWidget::sizePolicy(this_00);
    policy.data = (uint)QVar2.field_0 & 0xdfffffff | (this->align & 0x1000U) << 0x11;
    QVar2 = QWidget::sizePolicy(this_00);
    if ((anon_union_4_2_313b0b05_for_QSizePolicy_1)policy.data != QVar2.field_0) {
      QWidget::setSizePolicy(this_00,(QSizePolicy)policy.bits);
    }
    this->field_0x340 = this->field_0x340 | 4;
  }
  QWidget::updateGeometry(this_00);
  local_30 = QWidget::contentsRect(this_00);
  QWidget::update(this_00,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::updateLabel()
{
    Q_Q(QLabel);
    valid_hints = false;

    if (isTextLabel) {
        QSizePolicy policy = q->sizePolicy();
        const bool wrap = align & Qt::TextWordWrap;
        policy.setHeightForWidth(wrap);
        if (policy != q->sizePolicy())  // ### should be replaced by WA_WState_OwnSizePolicy idiom
            q->setSizePolicy(policy);
        textLayoutDirty = true;
    }
    q->updateGeometry();
    q->update(q->contentsRect());
}